

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O3

void __thiscall lts2::LBDOperator::recordBasisMovie(LBDOperator *this,string *movieName)

{
  undefined4 uVar1;
  _InputArray *p_Var2;
  uint idx;
  int iVar3;
  double bmax;
  double bmin;
  VideoWriter movie;
  Mat grayFrame;
  Mat currrentFrame;
  Mat basisImage;
  _InputArray local_1d8;
  undefined8 uStack_1c0;
  double local_1b0;
  double local_1a8;
  _InputArray local_1a0;
  Size local_188;
  Size local_180;
  VideoWriter local_178 [40];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  uVar1 = cv::VideoWriter::fourcc('m','p','4','v');
  local_180 = this->_patchSize;
  cv::VideoWriter::VideoWriter((VideoWriter *)0x4000000000000000,local_178,movieName,uVar1);
  cv::Mat::Mat(local_f0);
  cv::Mat::Mat(local_150);
  local_188 = this->_patchSize;
  local_1d8.sz.width = 0;
  local_1d8.sz.height = 0;
  uStack_1c0 = 0;
  local_1d8.flags = 0;
  local_1d8._4_4_ = 0;
  local_1d8.obj = (Mat *)0x0;
  cv::Mat::Mat(local_90,&local_188,5);
  if (*(int *)&(this->super_LinearOperator).field_0xc != 0) {
    idx = 0;
    do {
      fillBasisFunctionForIndex(this,local_90,idx);
      local_1d8.sz.width = 0;
      local_1d8.sz.height = 0;
      local_1d8.flags = 0x1010000;
      local_1d8.obj = local_90;
      p_Var2 = (_InputArray *)cv::noArray();
      iVar3 = 0;
      cv::minMaxLoc(&local_1d8,&local_1a8,&local_1b0,(Point_ *)0x0,(Point_ *)0x0,p_Var2);
      local_1d8.sz.width = 0;
      local_1d8.sz.height = 0;
      local_1d8.flags = 0x2010000;
      local_1d8.obj = local_150;
      cv::Mat::convertTo((_OutputArray *)local_90,(int)&local_1d8,255.0 / (local_1b0 - local_1a8),
                         (local_1a8 * -255.0) / (local_1b0 - local_1a8));
      local_1d8.sz.width = 0;
      local_1d8.sz.height = 0;
      local_1d8.flags = 0x1010000;
      local_1a0.sz.width = 0;
      local_1a0.sz.height = 0;
      local_1a0.flags = 0x2010000;
      local_1d8.obj = local_150;
      local_1a0.obj = local_f0;
      cv::cvtColor((cv *)&local_1d8,&local_1a0,(_OutputArray *)0x8,0,iVar3);
      cv::VideoWriter::operator<<(local_178,local_f0);
      idx = idx + 1;
    } while (idx < *(uint *)&(this->super_LinearOperator).field_0xc);
  }
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat(local_150);
  cv::Mat::~Mat(local_f0);
  cv::VideoWriter::~VideoWriter(local_178);
  return;
}

Assistant:

void lts2::LBDOperator::recordBasisMovie(std::string const& movieName)
{
  cv::VideoWriter movie(movieName, cv::VideoWriter::fourcc('m', 'p', '4', 'v'), 2.0, _patchSize);
    
    cv::Mat currrentFrame, grayFrame;
    cv::Mat basisImage(_patchSize, CV_32F, cv::Scalar(0));
    
    double bmin, bmax;
    
    for (int i = 0; i < _pairsInUse; ++i)
    {
        // Fill basis image
        fillBasisFunctionForIndex(basisImage, i);
        cv::minMaxLoc(basisImage, &bmin, &bmax);
        
        // Convert to uchar
        basisImage.convertTo(grayFrame, CV_8U, 255.0/(bmax-bmin), -255.0*bmin/(bmax-bmin));
        
        // Color
        cv::cvtColor(grayFrame, currrentFrame, cv::COLOR_GRAY2BGR);
        
        movie << currrentFrame;
    }
}